

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAlignment.h
# Opt level: O2

bool __thiscall
BamTools::BamAlignment::GetTag<float>(BamAlignment *this,string *tag,float *destination)

{
  size_type sVar1;
  bool bVar2;
  ulong uVar3;
  size_t sStack_20;
  char *pTagData;
  uint numBytesParsed;
  uint tagDataLength;
  
  if (((this->SupportData).HasCoreOnly == false) &&
     (sVar1 = (this->TagData)._M_string_length, sVar1 != 0)) {
    pTagData = (this->TagData)._M_dataplus._M_p;
    tagDataLength = (uint)sVar1;
    numBytesParsed = 0;
    bVar2 = FindTag(this,tag,&pTagData,&tagDataLength,&numBytesParsed);
    if (bVar2) {
      bVar2 = false;
      uVar3 = (ulong)((byte)pTagData[-1] - 0x41);
      if ((byte)pTagData[-1] - 0x41 < 0x33) {
        if ((0x400000005U >> (uVar3 & 0x3f) & 1) == 0) {
          if ((0x12000000100U >> (uVar3 & 0x3f) & 1) == 0) {
            if ((0x4000000040000U >> (uVar3 & 0x3f) & 1) == 0) {
              return false;
            }
            sStack_20 = 2;
          }
          else {
            sStack_20 = 4;
          }
        }
        else {
          sStack_20 = 1;
        }
        *destination = 0.0;
        memcpy(destination,pTagData,sStack_20);
        bVar2 = true;
      }
    }
    else {
      bVar2 = false;
    }
    return bVar2;
  }
  return false;
}

Assistant:

inline bool BamAlignment::GetTag(const std::string& tag, T& destination) const
{

    // skip if alignment is core-only
    if (SupportData.HasCoreOnly) {
        // TODO: set error string?
        return false;
    }

    // skip if no tags present
    if (TagData.empty()) {
        // TODO: set error string?
        return false;
    }

    // localize the tag data
    char* pTagData = (char*)TagData.data();
    const unsigned int tagDataLength = TagData.size();
    unsigned int numBytesParsed = 0;

    // return failure if tag not found
    if (!FindTag(tag, pTagData, tagDataLength, numBytesParsed)) {
        // TODO: set error string?
        return false;
    }

    // fetch data type
    const char type = *(pTagData - 1);
    if (!TagTypeHelper<T>::CanConvertFrom(type)) {
        // TODO: set error string ?
        return false;
    }

    // determine data length
    int destinationLength = 0;
    switch (type) {

        // 1 byte data
        case (Constants::BAM_TAG_TYPE_ASCII):
        case (Constants::BAM_TAG_TYPE_INT8):
        case (Constants::BAM_TAG_TYPE_UINT8):
            destinationLength = 1;
            break;

        // 2 byte data
        case (Constants::BAM_TAG_TYPE_INT16):
        case (Constants::BAM_TAG_TYPE_UINT16):
            destinationLength = 2;
            break;

        // 4 byte data
        case (Constants::BAM_TAG_TYPE_INT32):
        case (Constants::BAM_TAG_TYPE_UINT32):
        case (Constants::BAM_TAG_TYPE_FLOAT):
            destinationLength = 4;
            break;

        // var-length types not supported for numeric destination
        case (Constants::BAM_TAG_TYPE_STRING):
        case (Constants::BAM_TAG_TYPE_HEX):
        case (Constants::BAM_TAG_TYPE_ARRAY):
            SetErrorString("BamAlignment::GetTag",
                           "cannot store variable length tag data into a numeric destination");
            return false;

        // unrecognized tag type
        default:
            const std::string message = std::string("invalid tag type: ") + type;
            SetErrorString("BamAlignment::GetTag", message);
            return false;
    }

    // store data in destination
    destination = 0;
    memcpy(&destination, pTagData, destinationLength);

    // return success
    return true;
}